

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mesh.cpp
# Opt level: O2

void __thiscall CMU462::DynamicScene::Mesh::draw_edges(Mesh *this)

{
  list<CMU462::Edge,_std::allocator<CMU462::Edge>_> *plVar1;
  Edge *pEVar2;
  DrawStyle *this_00;
  _List_node_base *p_Var3;
  
  pEVar2 = HalfedgeElement::getEdge((((this->super_SceneObject).scene)->hovered).element);
  if (pEVar2 != (Edge *)0x0) {
    p_Var3 = (pEVar2->_halfedge)._M_node[3]._M_next;
    this_00 = get_draw_style(this,(HalfedgeElement *)(p_Var3 + 1));
    DrawStyle::style_edge(this_00);
    glBegin(1);
    glVertex3dv(&p_Var3[6]._M_prev[2]._M_prev[1]._M_prev);
    glVertex3dv(&p_Var3[6]._M_prev[1]._M_prev[2]._M_prev[1]._M_prev);
    glEnd();
  }
  DrawStyle::style_edge(this->defaultStyle);
  glBegin(1);
  plVar1 = &(this->mesh).edges;
  p_Var3 = (_List_node_base *)plVar1;
  while (p_Var3 = (((_List_base<CMU462::Edge,_std::allocator<CMU462::Edge>_> *)&p_Var3->_M_next)->
                  _M_impl)._M_node.super__List_node_base._M_next,
        p_Var3 != (_List_node_base *)plVar1) {
    glVertex3dv(&p_Var3[6]._M_prev[2]._M_prev[1]._M_prev);
    glVertex3dv(&p_Var3[6]._M_prev[1]._M_prev[2]._M_prev[1]._M_prev);
  }
  glEnd();
  DrawStyle::style_reset(this->defaultStyle);
  return;
}

Assistant:

void Mesh::draw_edges() const
{

   // Draw seleted edge
   Edge* ep = scene->hovered.element->getEdge();
   if( ep )
   {
      EdgeIter e = ep->halfedge()->edge();

      DrawStyle *style = get_draw_style(elementAddress(e));
      style->style_edge();

      glBegin(GL_LINES);
      glVertex3dv(&e->halfedge()->vertex()->position.x);
      glVertex3dv(&e->halfedge()->twin()->vertex()->position.x);
      glEnd();
   }

   // Draw all edges
   defaultStyle->style_edge();
   glBegin(GL_LINES);
   for( EdgeCIter e = mesh.edgesBegin(); e != mesh.edgesEnd(); e++ )
   {
      glVertex3dv(&e->halfedge()->vertex()->position.x);
      glVertex3dv(&e->halfedge()->twin()->vertex()->position.x);
   }
   glEnd();

   defaultStyle->style_reset();
}